

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O2

void bignum_rshift(bn *a,bn *b,int nbits)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t *puVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (a == (bn *)0x0) {
    __assert_fail("a && \"a is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x161,"void bignum_rshift(struct bn *, struct bn *, int)");
  }
  if (b == (bn *)0x0) {
    __assert_fail("b && \"b is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x162,"void bignum_rshift(struct bn *, struct bn *, int)");
  }
  if (nbits < 0) {
    __assert_fail("nbits >= 0 && \"no negative shifts\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x163,"void bignum_rshift(struct bn *, struct bn *, int)");
  }
  bignum_assign(b,a);
  if (0x1f < (uint)nbits) {
    if ((uint)nbits < 0x400) {
      uVar4 = (ulong)(0x20 - ((uint)nbits >> 5));
      uVar5 = uVar4;
      puVar6 = b->array;
      while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
        *puVar6 = puVar6[(uint)nbits >> 5];
        puVar6 = puVar6 + 1;
      }
      for (; uVar4 != 0x20; uVar4 = uVar4 + 1) {
        b->array[uVar4] = 0;
      }
    }
    else {
      for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
        b->array[lVar3] = 0;
      }
    }
    nbits = nbits & 0x1f;
  }
  if (nbits != 0) {
    for (lVar3 = 0; lVar3 != 0x1f; lVar3 = lVar3 + 1) {
      bVar2 = (byte)nbits & 0x1f;
      b->array[lVar3] = b->array[lVar3] >> bVar2 | b->array[lVar3 + 1] << 0x20 - bVar2;
    }
    b->array[0x1f] = b->array[0x1f] >> ((byte)nbits & 0x1f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void bignum_rshift(struct bn* a, struct bn* b, int nbits)
{
  require(a, "a is null");
  require(b, "b is null");
  require(nbits >= 0, "no negative shifts");
  
  bignum_assign(b, a);
  /* Handle shift in multiples of word-size */
  const int nbits_pr_word = (WORD_SIZE * 8);
  int nwords = nbits / nbits_pr_word;
  if (nwords != 0)
  {
    _rshift_word(b, nwords);
    nbits -= (nwords * nbits_pr_word);
  }

  if (nbits != 0)
  {
    int i;
    for (i = 0; i < (BN_ARRAY_SIZE - 1); ++i)
    {
      b->array[i] = (b->array[i] >> nbits) | (b->array[i + 1] << ((8 * WORD_SIZE) - nbits));
    }
    b->array[i] >>= nbits;
  }
  
}